

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall kws::Parser::GetPositionWithComments(Parser *this,size_t pos)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_RSI;
  const_iterator it;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_00;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_18;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  local_18._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if ((!bVar1) ||
       (this_00 = local_10,
       ppVar2 = __gnu_cxx::
                __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::operator*(&local_18),
       this_00 < (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)ppVar2->first)) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(&local_18);
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          *)ppVar2->second;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(&local_18);
    local_10 = (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)(((long)in_stack_ffffffffffffffc0 - ppVar2->first) + (long)local_10);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  return (size_t)local_10;
}

Assistant:

size_t Parser::GetPositionWithComments(size_t pos) const
{
  auto it = m_CommentPositions.begin();
  while(it != m_CommentPositions.end())
    {
    if((pos>=(*it).first))
      {
      pos += ((*it).second-(*it).first);
      }
    else
      {
      break;
      }
    it++;
    }
  return pos;
}